

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colStrBuf.c
# Opt level: O2

void Col_StringBufferRelease(Col_Word strbuf,size_t length)

{
  uint uVar1;
  long lVar2;
  
  if (strbuf == 0) {
    strbuf = 0;
  }
  else {
    if ((strbuf & 0xf) == 0) {
      if ((*(byte *)strbuf & 2) == 0) goto LAB_0010c5d6;
      uVar1 = *(byte *)strbuf & 0xfffffffe;
    }
    else {
      uVar1 = immediateWordTypes[(uint)strbuf & 0x1f];
    }
    if ((uVar1 == 2) && ((*(byte *)(strbuf + 2) & 0xc) == 0)) {
      strbuf = *(Col_Word *)(strbuf + 0x10);
    }
  }
LAB_0010c5d6:
  lVar2 = 0;
  if (length <= *(ulong *)(strbuf + 0x10)) {
    lVar2 = *(ulong *)(strbuf + 0x10) - length;
  }
  *(long *)(strbuf + 0x10) = lVar2;
  return;
}

Assistant:

void
Col_StringBufferRelease(
    Col_Word strbuf,    /*!< String buffer to release. */
    size_t length)      /*!< Number of characters to release. */
{
    /*
     * Check preconditions.
     */

    /*! @typecheck{COL_ERROR_STRBUF,strbuf} */
    TYPECHECK_STRBUF(strbuf) return;

    WORD_UNWRAP(strbuf);

    if (WORD_STRBUF_LENGTH(strbuf) < length) {
        WORD_STRBUF_LENGTH(strbuf) = 0;
    } else {
        /*!
         * @sideeffect
         * Decrease current length.
         */
        WORD_STRBUF_LENGTH(strbuf) -= length;
    }
}